

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts3DoclistPrev
               (int bDescIdx,char *aDoclist,int nDoclist,char **ppIter,sqlite3_int64 *piDocid,
               int *pnList,u8 *pbEof)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  sqlite3_int64 iVal;
  long local_38;
  
  if (*ppIter == (char *)0x0) {
    pcVar7 = aDoclist + nDoclist;
    if (nDoclist < 1) {
      pcVar3 = (char *)0x0;
      lVar10 = 0;
LAB_001cb91f:
      *pnList = (int)pcVar7 - (int)pcVar3;
      *ppIter = pcVar3;
      *piDocid = lVar10;
      return;
    }
    lVar10 = 0;
    uVar8 = 1;
    do {
      iVar6 = sqlite3Fts3GetVarint(aDoclist,&local_38);
      pcVar3 = aDoclist + iVar6;
      bVar4 = aDoclist[iVar6];
      aDoclist = pcVar3;
      if (bVar4 != 0) {
        do {
          pbVar9 = (byte *)(aDoclist + 1);
          aDoclist = aDoclist + 1;
          bVar5 = bVar4 & 0x80;
          bVar4 = *pbVar9;
        } while (bVar5 != 0 || *pbVar9 != 0);
      }
      lVar10 = lVar10 + uVar8 * local_38;
      do {
        aDoclist = aDoclist + 1;
        if (pcVar7 <= aDoclist) goto LAB_001cb91f;
        uVar8 = -(ulong)(bDescIdx != 0) | 1;
      } while (*aDoclist == '\0');
    } while( true );
  }
  for (pcVar7 = *ppIter + -2; (aDoclist <= pcVar7 && (*pcVar7 < '\0')); pcVar7 = pcVar7 + -1) {
  }
  pbVar9 = (byte *)(pcVar7 + 1);
  sqlite3Fts3GetVarint((char *)pbVar9,&local_38);
  lVar10 = -local_38;
  if (bDescIdx != 0) {
    lVar10 = local_38;
  }
  *piDocid = *piDocid + lVar10;
  if (pbVar9 != (byte *)aDoclist) {
    pbVar1 = (byte *)(pcVar7 + -1);
    do {
      if (pbVar1 <= aDoclist) {
        bVar4 = 0;
        pbVar2 = pbVar1;
        break;
      }
      bVar4 = *pbVar1;
      pbVar1 = pbVar1 + -1;
      pbVar2 = pbVar1;
    } while (bVar4 == 0);
    do {
      if (pbVar1 <= aDoclist) goto LAB_001cb8e5;
      bVar5 = *pbVar1;
      pbVar2 = pbVar1;
      if (bVar4 == 0 && (bVar5 & 0x80) == 0) goto LAB_001cb8f2;
      pbVar1 = pbVar1 + -1;
      pbVar2 = (byte *)aDoclist;
      bVar4 = bVar5;
    } while( true );
  }
  *pbEof = '\x01';
LAB_001cb915:
  *ppIter = (char *)pbVar9;
  return;
LAB_001cb8e5:
  if ((bVar4 == 0) && (pbVar2 + 2 < pbVar9)) {
LAB_001cb8f2:
    pbVar2 = pbVar2 + 2;
  }
  iVar6 = ((int)pcVar7 - (int)pbVar2) + 1;
  do {
    iVar6 = iVar6 + -1;
    bVar4 = *pbVar2;
    pbVar2 = pbVar2 + 1;
  } while ((char)bVar4 < '\0');
  *pnList = iVar6;
  pbVar9 = pbVar2;
  goto LAB_001cb915;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3DoclistPrev(
  int bDescIdx,                   /* True if the doclist is desc */
  char *aDoclist,                 /* Pointer to entire doclist */
  int nDoclist,                   /* Length of aDoclist in bytes */
  char **ppIter,                  /* IN/OUT: Iterator pointer */
  sqlite3_int64 *piDocid,         /* IN/OUT: Docid pointer */
  int *pnList,                    /* OUT: List length pointer */
  u8 *pbEof                       /* OUT: End-of-file flag */
){
  char *p = *ppIter;

  assert( nDoclist>0 );
  assert( *pbEof==0 );
  assert( p || *piDocid==0 );
  assert( !p || (p>aDoclist && p<&aDoclist[nDoclist]) );

  if( p==0 ){
    sqlite3_int64 iDocid = 0;
    char *pNext = 0;
    char *pDocid = aDoclist;
    char *pEnd = &aDoclist[nDoclist];
    int iMul = 1;

    while( pDocid<pEnd ){
      sqlite3_int64 iDelta;
      pDocid += sqlite3Fts3GetVarint(pDocid, &iDelta);
      iDocid += (iMul * iDelta);
      pNext = pDocid;
      fts3PoslistCopy(0, &pDocid);
      while( pDocid<pEnd && *pDocid==0 ) pDocid++;
      iMul = (bDescIdx ? -1 : 1);
    }

    *pnList = (int)(pEnd - pNext);
    *ppIter = pNext;
    *piDocid = iDocid;
  }else{
    int iMul = (bDescIdx ? -1 : 1);
    sqlite3_int64 iDelta;
    fts3GetReverseVarint(&p, aDoclist, &iDelta);
    *piDocid -= (iMul * iDelta);

    if( p==aDoclist ){
      *pbEof = 1;
    }else{
      char *pSave = p;
      fts3ReversePoslist(aDoclist, &p);
      *pnList = (int)(pSave - p);
    }
    *ppIter = p;
  }
}